

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::OverlappingExtensionRangeTest_ExtensionRangeBefore_Test::
TestBody(OverlappingExtensionRangeTest_ExtensionRangeBefore_Test *this)

{
  DescriptorProto *parent;
  FileDescriptor *pFVar1;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  AssertHelper local_200;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  MockErrorCollector error_collector;
  DescriptorPool pool;
  FileDescriptorProto foo_file;
  
  FileDescriptorProto::FileDescriptorProto(&foo_file);
  foo_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       foo_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  if ((foo_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    foo_file.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (foo_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&foo_file.field_0._impl_.name_,"foo.proto",
             (Arena *)foo_file.super_Message.super_MessageLite._internal_metadata_.ptr_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pool,"Foo",(allocator<char> *)&error_collector);
  parent = AddMessage(&foo_file,(string *)&pool);
  std::__cxx11::string::~string((string *)&pool);
  AddExtensionRange(parent,10,0x14);
  AddExtensionRange(parent,5,0xf);
  DescriptorPool::DescriptorPool(&pool);
  error_collector.text_._M_dataplus._M_p = (pointer)&error_collector.text_.field_2;
  error_collector.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__MockErrorCollector_015ffce0;
  error_collector.text_._M_string_length = 0;
  error_collector.text_.field_2._M_local_buf[0] = '\0';
  error_collector.warning_text_._M_dataplus._M_p = (pointer)&error_collector.warning_text_.field_2;
  error_collector.warning_text_._M_string_length = 0;
  error_collector.warning_text_.field_2._M_local_buf[0] = '\0';
  pFVar1 = DescriptorPool::BuildFileCollectingErrors
                     (&pool,&foo_file,&error_collector.super_ErrorCollector);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pFVar1 == (FileDescriptor *)0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    testing::internal::CmpHelperEQ<char[95],std::__cxx11::string>
              ((internal *)&gtest_ar,
               "\"foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with \" \"already-defined range 10 to 19.\\n\""
               ,"error_collector.text_",
               (char (*) [95])
               "foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with already-defined range 10 to 19.\n"
               ,&error_collector.text_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = anon_var_dwarf_651463 + 5;
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x9ef,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
    }
    this_00 = &gtest_ar.message_;
  }
  else {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)
               "pool.BuildFileCollectingErrors(foo_file, &error_collector) == nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x9eb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  MockErrorCollector::~MockErrorCollector(&error_collector);
  DescriptorPool::~DescriptorPool(&pool);
  FileDescriptorProto::~FileDescriptorProto(&foo_file);
  return;
}

Assistant:

TEST(OverlappingExtensionRangeTest, ExtensionRangeBefore) {
  // Build descriptors for the following definitions:
  //
  //   message Foo {
  //     extensions 10 to 19;
  //     extensions 5 to 14;
  //   }
  FileDescriptorProto foo_file;
  foo_file.set_name("foo.proto");

  DescriptorProto* foo = AddMessage(&foo_file, "Foo");
  AddExtensionRange(foo, 10, 20);
  AddExtensionRange(foo, 5, 15);

  DescriptorPool pool;
  MockErrorCollector error_collector;
  // The extensions ranges are invalid, so the proto shouldn't build.
  ASSERT_TRUE(pool.BuildFileCollectingErrors(foo_file, &error_collector) ==
              nullptr);
  ASSERT_EQ(
      "foo.proto: Foo: NUMBER: Extension range 5 to 14 overlaps with "
      "already-defined range 10 to 19.\n",
      error_collector.text_);
}